

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error externalEntityInitProcessor2(XML_Parser parser,char *start,char *end,char **endPtr)

{
  int iVar1;
  XML_Error XVar2;
  char *next;
  char *local_28;
  
  local_28 = start;
  iVar1 = (*parser->m_encoding->scanners[1])(parser->m_encoding,start,end,&local_28);
  if (iVar1 == -2) {
    local_28 = start;
    if ((parser->m_parsingStatus).finalBuffer != '\0') {
      parser->m_eventPtr = start;
      return XML_ERROR_PARTIAL_CHAR;
    }
  }
  else if (iVar1 == -1) {
    local_28 = start;
    if ((parser->m_parsingStatus).finalBuffer != '\0') {
      parser->m_eventPtr = start;
      return XML_ERROR_UNCLOSED_TOKEN;
    }
  }
  else if (((iVar1 != 0xe) || (start = local_28, local_28 != end)) ||
          ((parser->m_parsingStatus).finalBuffer != '\0')) {
    parser->m_processor = externalEntityInitProcessor3;
    XVar2 = externalEntityInitProcessor3(parser,start,end,endPtr);
    return XVar2;
  }
  *endPtr = local_28;
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error PTRCALL
externalEntityInitProcessor2(XML_Parser parser,
                             const char *start,
                             const char *end,
                             const char **endPtr)
{
  const char *next = start; /* XmlContentTok doesn't always set the last arg */
  int tok = XmlContentTok(encoding, start, end, &next);
  switch (tok) {
  case XML_TOK_BOM:
    /* If we are at the end of the buffer, this would cause the next stage,
       i.e. externalEntityInitProcessor3, to pass control directly to
       doContent (by detecting XML_TOK_NONE) without processing any xml text
       declaration - causing the error XML_ERROR_MISPLACED_XML_PI in doContent.
    */
    if (next == end && !ps_finalBuffer) {
      *endPtr = next;
      return XML_ERROR_NONE;
    }
    start = next;
    break;
  case XML_TOK_PARTIAL:
    if (!ps_finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_UNCLOSED_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (!ps_finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_PARTIAL_CHAR;
  }
  processor = externalEntityInitProcessor3;
  return externalEntityInitProcessor3(parser, start, end, endPtr);
}